

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t invalid_mbs(void *_p,size_t n,archive_string_conv *sc)

{
  wchar_t local_44;
  wchar_t wc;
  mbstate_t shift_state;
  size_t r;
  char *p;
  archive_string_conv *sc_local;
  size_t n_local;
  void *_p_local;
  
  memset(&stack0xffffffffffffffc0,0,8);
  r = (size_t)_p;
  sc_local = (archive_string_conv *)n;
  while( true ) {
    if (sc_local == (archive_string_conv *)0x0) {
      return L'\0';
    }
    shift_state = (mbstate_t)
                  mbrtowc(&local_44,(char *)r,(size_t)sc_local,(mbstate_t *)&stack0xffffffffffffffc0
                         );
    if ((shift_state == (mbstate_t)0xffffffffffffffff) ||
       (shift_state == (mbstate_t)0xfffffffffffffffe)) break;
    if (shift_state == (mbstate_t)0x0) {
      return L'\0';
    }
    r = (long)shift_state + r;
    sc_local = (archive_string_conv *)((long)sc_local - (long)shift_state);
  }
  return L'\xffffffff';
}

Assistant:

static int
invalid_mbs(const void *_p, size_t n, struct archive_string_conv *sc)
{
	const char *p = (const char *)_p;
	size_t r;

#if HAVE_MBRTOWC
	mbstate_t shift_state;

	memset(&shift_state, 0, sizeof(shift_state));
#else
	/* Clear the shift state before starting. */
	mbtowc(NULL, NULL, 0);
#endif
	while (n) {
		wchar_t wc;

#if HAVE_MBRTOWC
		r = mbrtowc(&wc, p, n, &shift_state);
#else
		r = mbtowc(&wc, p, n);
#endif
		if (r == (size_t)-1 || r == (size_t)-2)
			return (-1);/* Invalid. */
		if (r == 0)
			break;
		p += r;
		n -= r;
	}
	(void)sc; /* UNUSED */
	return (0); /* All Okey. */
}